

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilter::UpdateState
          (UnscentedKalmanFilter *this,VectorXd *z,VectorXd *z_pred,MatrixXd *S,MatrixXd *Xsig_pred,
          MatrixXd *Zsig,VectorXd *x,MatrixXd *P)

{
  CoeffReturnType pdVar1;
  PlainObject *other;
  ostream *poVar2;
  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *m;
  long i;
  MatrixXd K;
  VectorXd z_diff;
  MatrixXd Tc;
  int n_x;
  int n_z;
  VectorXd x_diff;
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_148;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_38;
  
  n_z = (int)(z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
  n_x = (int)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Tc,&n_x,&n_z);
  es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&Tc,(Scalar *)&es);
  for (i = 0; i < this->n_sigma_; i = i + 1) {
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_148,Zsig
               ,i);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&es,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                       *)&local_148,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z_pred);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)&K,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&es);
    (*this->current_sensor_->_vptr_Sensor[3])
              (this->current_sensor_,(Matrix<double,_1,1,0,_1,1> *)&K);
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_148,
               Xsig_pred,i);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,true>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&es,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                       *)&local_148,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,_1,1,0,_1,1> *)&x_diff,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&es);
    NormalizeState(this,&x_diff);
    pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->weights_c_,i);
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (DenseIndex)*pdVar1;
    es.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (complex<double> *)0x0;
    es.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = 0;
    es.m_isInitialized = false;
    es.m_eigenvectorsOk = false;
    es._42_6_ = 0;
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&x_diff;
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (DenseIndex)&K;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
                *)&local_148,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Tc,
               (MatrixBase<Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>
                *)&es);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Tc,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                *)&local_148);
    free(es.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    free(x_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  local_148.m_lhs =
       (LhsNested)
       Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                 ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)S);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&es,&Tc,
                (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&local_148);
  other = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&es);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&K,other);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
  ::~ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&es);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&es,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)z,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z_pred);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&z_diff,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&es);
  (*this->current_sensor_->_vptr_Sensor[3])(this->current_sensor_,&z_diff);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *)&es,&K,&z_diff);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
              *)&local_148,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)x,
             (MatrixBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
              *)&es);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)x,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>_>
              *)&local_148);
  free((void *)es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols);
  NormalizeState(this,x);
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::ProductBase(&local_148,&K,S);
  local_38.m_matrix = &K;
  Eigen::
  ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)&es,(GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
                        *)&local_148,&local_38);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>
              *)&x_diff,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P,
             (MatrixBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>
              *)&es);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)P,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
              *)&x_diff);
  free((void *)es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols);
  free(local_148.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  if (1 < this->debug_) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Update done:");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"z:\n");
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)z;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&es);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"z_pred:\n");
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)z_pred;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&es);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
         4;
    poVar2 = std::operator<<((ostream *)&std::cout,"Xsig_pred:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      Xsig_pred);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Zsig:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Zsig);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Tc:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&Tc);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"S:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)S);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"S inverse:\n");
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)
         Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                   ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)S);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                       *)&es);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"K:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&K);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"K transpose:\n");
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&K;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&es);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"P:\n");
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"P inverse:\n");
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)
         Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                   ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                                       *)&es);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"x:\n");
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)x;
    poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&es);
    std::endl<char,std::char_traits<char>>(poVar2);
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver(&es,P,true);
    poVar2 = std::operator<<((ostream *)&std::cout,"Eigenvalues of P:\n");
    m = (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
        Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues(&es);
    poVar2 = Eigen::operator<<(poVar2,m);
    std::endl<char,std::char_traits<char>>(poVar2);
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver(&es);
  }
  free(z_diff.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Tc.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void UnscentedKalmanFilter::UpdateState(const VectorXd &z, const VectorXd &z_pred, const MatrixXd &S, 
		const MatrixXd &Xsig_pred, const MatrixXd &Zsig, VectorXd &x, MatrixXd &P) const {

   int n_z = z_pred.rows();	
   int n_x = x.rows();

   // calculate cross correlation matrix
   MatrixXd Tc(n_x, n_z);

   Tc.fill(0.0);

   for (int i=0; i<n_sigma_; i++) {  // 2n+1 sigma points

       // residual
       VectorXd z_diff = Zsig.col(i) - z_pred;
       current_sensor_->NormalizeMeasurement(z_diff);

       // state difference
       VectorXd x_diff = Xsig_pred.col(i) - x;
       NormalizeState(x_diff);

       Tc = Tc + weights_c_(i) * x_diff * z_diff.transpose();
   }

   // Kalman gain K;
   MatrixXd K = Tc * S.inverse();

   // residual
   VectorXd z_diff = z - z_pred;
   current_sensor_->NormalizeMeasurement(z_diff);

   // update state mean and covariance matrix
   x = x + K * z_diff;
   NormalizeState(x);
   P = P - K*S*K.transpose();

   if (debug_ > 1) {
       std::cout << "Update done:" << endl;
       std::cout << "z:\n" << z.transpose() << std::endl;
       std::cout << "z_pred:\n" << z_pred.transpose() << std::endl;
       std::cout << std::fixed << "Xsig_pred:\n" << Xsig_pred << std::endl;
       std::cout << "Zsig:\n" << Zsig << std::endl;
       std::cout << "Tc:\n" << Tc << std::endl;
       std::cout << "S:\n" << S << std::endl;
       std::cout << "S inverse:\n" << S.inverse() << std::endl;
       std::cout << "K:\n" << K << std::endl;
       std::cout << "K transpose:\n" << K.transpose() << std::endl;
       std::cout << "P:\n" << P << std::endl;
       std::cout << "P inverse:\n" << P.inverse() << std::endl;
       std::cout << "x:\n" << x.transpose() << std::endl;
       Eigen::EigenSolver<MatrixXd> es(P);
       cout << "Eigenvalues of P:\n" << es.eigenvalues() << endl;
    }
}